

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMurHash.c
# Opt level: O0

uint32_t PMurHash32_Result(uint32_t h,uint32_t carry,uint32_t total_length)

{
  uint uVar1;
  int n;
  uint32_t k1;
  uint32_t total_length_local;
  uint32_t carry_local;
  uint32_t h_local;
  
  total_length_local = h;
  if ((carry & 3) != 0) {
    uVar1 = carry >> (('\x04' - (char)(carry & 3)) * '\b' & 0x1fU);
    total_length_local = (uVar1 * 0x16a88000 | uVar1 * -0x3361d2af >> 0x11) * 0x1b873593 ^ h;
  }
  uVar1 = ((total_length ^ total_length_local) >> 0x10 ^ total_length ^ total_length_local) *
          -0x7a143595;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51cb;
  return uVar1 >> 0x10 ^ uVar1;
}

Assistant:

uint32_t PMurHash32_Result(uint32_t h, uint32_t carry, uint32_t total_length)
{
  uint32_t k1;
  int n = carry & 3;
  if(n) {
    k1 = carry >> (4-n)*8;
    k1 *= C1; k1 = ROTL32(k1,15); k1 *= C2; h ^= k1;
  }
  h ^= total_length;

  /* fmix */
  h ^= h >> 16;
  h *= 0x85ebca6b;
  h ^= h >> 13;
  h *= 0xc2b2ae35;
  h ^= h >> 16;

  return h;
}